

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

int Gia_ManNameIsLegalInVerilog(char *pName)

{
  char *pcVar1;
  char *local_18;
  char *pName_local;
  
  if ((pName != (char *)0x0) && (*pName != '\0')) {
    if (*pName == '\\') {
      pName_local._4_4_ = 1;
    }
    else if ((((*pName < 'a') || (local_18 = pName, 'z' < *pName)) &&
             ((*pName < 'A' || (local_18 = pName, 'Z' < *pName)))) &&
            (local_18 = pName, *pName != '_')) {
      pName_local._4_4_ = 0;
    }
    else {
      do {
        pcVar1 = local_18 + 1;
        if (local_18[1] == '\0') {
          return 1;
        }
        local_18 = pcVar1;
      } while (((('`' < *pcVar1) && (*pcVar1 < '{')) || (('@' < *pcVar1 && (*pcVar1 < '[')))) ||
              (((('/' < *pcVar1 && (*pcVar1 < ':')) || (*pcVar1 == '_')) || (*pcVar1 == '$'))));
      pName_local._4_4_ = 0;
    }
    return pName_local._4_4_;
  }
  __assert_fail("pName != NULL && *pName != \'\\0\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                ,0x4ca,"int Gia_ManNameIsLegalInVerilog(char *)");
}

Assistant:

int Gia_ManNameIsLegalInVerilog( char * pName )
{
    // identifier ::= simple_identifier | escaped_identifier
    // simple_identifier ::= [a-zA-Z_][a-zA-Z0-9_$]
    // escaped_identifier ::= \ {Any_ASCII_character_except_white_space} white_space
    // white_space ::= space | tab | newline
    assert( pName != NULL && *pName != '\0' );
    if ( *pName == '\\' )
        return 1;
    if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && *pName != '_' )
        return 0;
    while ( *(++pName) )
        if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && (*pName < '0' || *pName > '9') && *pName != '_' && *pName != '$' ) 
            return 0;
    return 1;
}